

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

uint32_t __thiscall spvtools::opt::Instruction::NumInOperandWords(Instruction *this)

{
  size_type sVar1;
  const_reference pvVar2;
  size_t sVar3;
  uint local_18;
  uint32_t local_14;
  uint32_t i;
  uint32_t size;
  Instruction *this_local;
  
  local_14 = 0;
  local_18 = TypeResultIdCount(this);
  while( true ) {
    sVar1 = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::size
                      (&this->operands_);
    if (sVar1 <= local_18) break;
    pvVar2 = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
             operator[](&this->operands_,(ulong)local_18);
    sVar3 = utils::SmallVector<unsigned_int,_2UL>::size(&pvVar2->words);
    local_14 = (int)sVar3 + local_14;
    local_18 = local_18 + 1;
  }
  return local_14;
}

Assistant:

uint32_t Instruction::NumInOperandWords() const {
  uint32_t size = 0;
  for (uint32_t i = TypeResultIdCount(); i < operands_.size(); ++i)
    size += static_cast<uint32_t>(operands_[i].words.size());
  return size;
}